

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_4_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  do {
    lVar22 = (long)horizontal_contributors->n0;
    fVar6 = *horizontal_coefficients;
    fVar7 = horizontal_coefficients[1];
    fVar8 = horizontal_coefficients[2];
    fVar9 = horizontal_coefficients[3];
    pfVar2 = decode_buffer + lVar22 * 4;
    fVar10 = pfVar2[1];
    fVar11 = pfVar2[2];
    fVar12 = pfVar2[3];
    pfVar3 = decode_buffer + lVar22 * 4 + 4;
    fVar13 = pfVar3[1];
    fVar14 = pfVar3[2];
    fVar15 = pfVar3[3];
    pfVar4 = decode_buffer + lVar22 * 4 + 8;
    fVar16 = pfVar4[1];
    fVar17 = pfVar4[2];
    fVar18 = pfVar4[3];
    pfVar5 = decode_buffer + lVar22 * 4 + 0xc;
    fVar19 = pfVar5[1];
    fVar20 = pfVar5[2];
    fVar21 = pfVar5[3];
    *output_buffer = fVar9 * *pfVar5 + fVar7 * *pfVar3 + fVar8 * *pfVar4 + *pfVar2 * fVar6;
    output_buffer[1] = fVar9 * fVar19 + fVar7 * fVar13 + fVar8 * fVar16 + fVar10 * fVar6;
    output_buffer[2] = fVar9 * fVar20 + fVar7 * fVar14 + fVar8 * fVar17 + fVar11 * fVar6;
    output_buffer[3] = fVar9 * fVar21 + fVar7 * fVar15 + fVar8 * fVar18 + fVar12 * fVar6;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}